

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O0

pair<llvm::StringRef,_llvm::StringRef> *
llvm::format_provider<llvm::iterator_range<llvm::StringRef_*>,_void>::parseOptions
          (pair<llvm::StringRef,_llvm::StringRef> *__return_storage_ptr__,StringRef Style)

{
  bool bVar1;
  size_t in_R8;
  StringRef Default;
  StringRef Default_00;
  StringRef local_58;
  undefined1 local_48 [8];
  StringRef Args;
  char *local_30;
  undefined1 local_28 [8];
  StringRef Sep;
  StringRef Style_local;
  
  Sep.Length = (size_t)Style.Data;
  StringRef::StringRef((StringRef *)&Args.Length,", ");
  Default.Length = in_R8;
  Default.Data = local_30;
  _local_28 = consumeOneOption((format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *)
                               &Sep.Length,(StringRef *)0x24,(char)Args.Length,Default);
  StringRef::StringRef(&local_58,"");
  Default_00.Length = in_R8;
  Default_00.Data = (char *)local_58.Length;
  _local_48 = consumeOneOption((format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *)
                               &Sep.Length,(StringRef *)0x40,(char)local_58.Data,Default_00);
  bVar1 = StringRef::empty((StringRef *)&Sep.Length);
  if (!bVar1) {
    __assert_fail("Style.empty() && \"Unexpected text in range option string!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                  ,0x187,
                  "static std::pair<StringRef, StringRef> llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::parseOptions(StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                 );
  }
  std::make_pair<llvm::StringRef&,llvm::StringRef&>
            (__return_storage_ptr__,(StringRef *)local_28,(StringRef *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<StringRef, StringRef> parseOptions(StringRef Style) {
    StringRef Sep = consumeOneOption(Style, '$', ", ");
    StringRef Args = consumeOneOption(Style, '@', "");
    assert(Style.empty() && "Unexpected text in range option string!");
    return std::make_pair(Sep, Args);
  }